

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_rtext.c
# Opt level: O0

void rtext_key(_rtext *x,int keynum,t_symbol *keysym)

{
  t_editor *ptVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  bool bVar5;
  uint32_t local_4c;
  int ch_nbytes;
  int n;
  char *s2;
  char *s1;
  int ndel;
  int newsize;
  int i;
  int indx;
  int h;
  int w;
  t_symbol *keysym_local;
  _rtext *p_Stack_10;
  int keynum_local;
  _rtext *x_local;
  
  indx = 0;
  i = 0;
  _h = keysym;
  keysym_local._4_4_ = keynum;
  p_Stack_10 = x;
  if ((keynum == 10) && ((x->x_text->field_0x2e & 3) == 3)) {
    gatom_key(x->x_text,keysym,10.0);
  }
  else {
    if (keynum == 0) {
      iVar2 = strcmp(keysym->s_name,"Home");
      if (iVar2 == 0) {
        if (p_Stack_10->x_selend == p_Stack_10->x_selstart) {
          p_Stack_10->x_selstart = 0;
          p_Stack_10->x_selend = 0;
        }
        else {
          p_Stack_10->x_selstart = 0;
        }
      }
      else {
        iVar2 = strcmp(_h->s_name,"End");
        if (iVar2 == 0) {
          if (p_Stack_10->x_selend == p_Stack_10->x_selstart) {
            p_Stack_10->x_selstart = p_Stack_10->x_bufsize;
            p_Stack_10->x_selend = p_Stack_10->x_bufsize;
          }
          else {
            p_Stack_10->x_selend = p_Stack_10->x_bufsize;
          }
        }
        else {
          iVar2 = strcmp(_h->s_name,"Right");
          if (iVar2 == 0) {
            if ((p_Stack_10->x_selend == p_Stack_10->x_selstart) &&
               (p_Stack_10->x_selstart < p_Stack_10->x_bufsize)) {
              u8_inc(p_Stack_10->x_buf,&p_Stack_10->x_selstart);
              p_Stack_10->x_selend = p_Stack_10->x_selstart;
            }
            else {
              p_Stack_10->x_selstart = p_Stack_10->x_selend;
            }
          }
          else {
            iVar2 = strcmp(_h->s_name,"Left");
            if (iVar2 == 0) {
              if ((p_Stack_10->x_selend == p_Stack_10->x_selstart) && (0 < p_Stack_10->x_selstart))
              {
                u8_dec(p_Stack_10->x_buf,&p_Stack_10->x_selstart);
                p_Stack_10->x_selend = p_Stack_10->x_selstart;
              }
              else {
                p_Stack_10->x_selend = p_Stack_10->x_selstart;
              }
            }
            else {
              iVar2 = strcmp(_h->s_name,"Up");
              if (iVar2 == 0) {
                if (p_Stack_10->x_selstart != 0) {
                  u8_dec(p_Stack_10->x_buf,&p_Stack_10->x_selstart);
                }
                while( true ) {
                  bVar5 = false;
                  if (0 < p_Stack_10->x_selstart) {
                    bVar5 = p_Stack_10->x_buf[p_Stack_10->x_selstart] != '\n';
                  }
                  if (!bVar5) break;
                  u8_dec(p_Stack_10->x_buf,&p_Stack_10->x_selstart);
                }
                p_Stack_10->x_selend = p_Stack_10->x_selstart;
              }
              else {
                iVar2 = strcmp(_h->s_name,"Down");
                if (iVar2 == 0) {
                  while( true ) {
                    bVar5 = false;
                    if (p_Stack_10->x_selend < p_Stack_10->x_bufsize) {
                      bVar5 = p_Stack_10->x_buf[p_Stack_10->x_selend] != '\n';
                    }
                    if (!bVar5) break;
                    u8_inc(p_Stack_10->x_buf,&p_Stack_10->x_selend);
                  }
                  if (p_Stack_10->x_selend < p_Stack_10->x_bufsize) {
                    u8_inc(p_Stack_10->x_buf,&p_Stack_10->x_selend);
                  }
                  p_Stack_10->x_selstart = p_Stack_10->x_selend;
                }
              }
            }
          }
        }
      }
    }
    else {
      local_4c = keynum;
      if (keynum == 0xd) {
        local_4c = 10;
      }
      if (local_4c == 8) {
        if ((x->x_selstart != 0) && (x->x_selstart == x->x_selend)) {
          u8_dec(x->x_buf,&x->x_selstart);
        }
      }
      else if (((local_4c == 0x7f) && (x->x_selend < x->x_bufsize)) &&
              (x->x_selstart == x->x_selend)) {
        u8_inc(x->x_buf,&x->x_selend);
      }
      iVar2 = p_Stack_10->x_selend - p_Stack_10->x_selstart;
      for (ndel = p_Stack_10->x_selend; ndel < p_Stack_10->x_bufsize; ndel = ndel + 1) {
        p_Stack_10->x_buf[ndel - iVar2] = p_Stack_10->x_buf[ndel];
      }
      iVar2 = p_Stack_10->x_bufsize - iVar2;
      pcVar4 = (char *)resizebytes(p_Stack_10->x_buf,(long)p_Stack_10->x_bufsize,(long)(iVar2 + 1));
      p_Stack_10->x_buf = pcVar4;
      p_Stack_10->x_buf[iVar2] = '\0';
      p_Stack_10->x_bufsize = iVar2;
      if ((local_4c == 10) || ((0x1f < (int)local_4c && ((int)local_4c < 0x7f)))) {
        iVar2 = p_Stack_10->x_bufsize + 1;
        pcVar4 = (char *)resizebytes(p_Stack_10->x_buf,(long)p_Stack_10->x_bufsize,
                                     (long)(p_Stack_10->x_bufsize + 2));
        p_Stack_10->x_buf = pcVar4;
        for (ndel = p_Stack_10->x_bufsize; p_Stack_10->x_selstart < ndel; ndel = ndel + -1) {
          p_Stack_10->x_buf[ndel] = p_Stack_10->x_buf[ndel + -1];
        }
        p_Stack_10->x_buf[p_Stack_10->x_selstart] = (char)local_4c;
        p_Stack_10->x_buf[iVar2] = '\0';
        p_Stack_10->x_bufsize = iVar2;
        p_Stack_10->x_selstart = p_Stack_10->x_selstart + 1;
      }
      else if (0x7f < (int)local_4c) {
        iVar2 = u8_wc_nbytes(local_4c);
        iVar3 = p_Stack_10->x_bufsize + iVar2;
        pcVar4 = (char *)resizebytes(p_Stack_10->x_buf,(long)p_Stack_10->x_bufsize,(long)(iVar3 + 1)
                                    );
        p_Stack_10->x_buf = pcVar4;
        ndel = iVar3;
        while (ndel = ndel + -1, p_Stack_10->x_selstart < ndel) {
          p_Stack_10->x_buf[ndel] = p_Stack_10->x_buf[ndel - iVar2];
        }
        p_Stack_10->x_buf[iVar3] = '\0';
        p_Stack_10->x_bufsize = iVar3;
        strncpy(p_Stack_10->x_buf + p_Stack_10->x_selstart,_h->s_name,(long)iVar2);
        p_Stack_10->x_selstart = p_Stack_10->x_selstart + iVar2;
      }
      p_Stack_10->x_selend = p_Stack_10->x_selstart;
      ptVar1 = p_Stack_10->x_glist->gl_editor;
      ptVar1->field_0x88 = ptVar1->field_0x88 & 0xef | 0x10;
    }
    rtext_senditup(p_Stack_10,2,&indx,&i,&newsize);
  }
  return;
}

Assistant:

void rtext_key(t_rtext *x, int keynum, t_symbol *keysym)
{
    int w = 0, h = 0, indx, i, newsize, ndel;
    char *s1, *s2;
        /* CR to atom boxes sends message and resets */
    if (keynum == '\n' && x->x_text->te_type == T_ATOM)
    {
        gatom_key(x->x_text, keysym, keynum);
        return;
    }
    if (keynum)
    {
        int n = keynum;
        if (n == '\r') n = '\n';
        if (n == '\b')  /* backspace */
        {
                    /* LATER delete the box if all text is selected...
                    this causes reentrancy problems now. */
            /* if ((!x->x_selstart) && (x->x_selend == x->x_bufsize))
            {
                ....
            } */
            if (x->x_selstart && (x->x_selstart == x->x_selend))
                u8_dec(x->x_buf, &x->x_selstart);
        }
        else if (n == 127)      /* delete */
        {
            if (x->x_selend < x->x_bufsize && (x->x_selstart == x->x_selend))
                u8_inc(x->x_buf, &x->x_selend);
        }

        ndel = x->x_selend - x->x_selstart;
        for (i = x->x_selend; i < x->x_bufsize; i++)
            x->x_buf[i- ndel] = x->x_buf[i];
        newsize = x->x_bufsize - ndel;
            /* allocate extra space for hidden null terminator */
        x->x_buf = resizebytes(x->x_buf, x->x_bufsize, newsize+1);
        x->x_buf[newsize] = 0;
        x->x_bufsize = newsize;

/* at Guenter's suggestion, use 'n>31' to test whether a character might
be printable in whatever 8-bit character set we find ourselves. */

/*-- moo:
  ... but test with "<" rather than "!=" in order to accommodate unicode
  codepoints for n (which we get since Tk is sending the "%A" substitution
  for bind <Key>), effectively reducing the coverage of this clause to 7
  bits.  Case n>127 is covered by the next clause.
*/
        if (n == '\n' || (n > 31 && n < 127))
        {
            newsize = x->x_bufsize+1;
                /* allocate extra space for hidden null terminator */
            x->x_buf = resizebytes(x->x_buf, x->x_bufsize, newsize+1);
            for (i = x->x_bufsize; i > x->x_selstart; i--)
                x->x_buf[i] = x->x_buf[i-1];
            x->x_buf[x->x_selstart] = n;
            x->x_buf[newsize] = 0;
            x->x_bufsize = newsize;
            x->x_selstart = x->x_selstart + 1;
        }
        /*--moo: check for unicode codepoints beyond 7-bit ASCII --*/
        else if (n > 127)
        {
            int ch_nbytes = u8_wc_nbytes(n);
            newsize = x->x_bufsize + ch_nbytes;
                /* allocate extra space for hidden null terminator */
            x->x_buf = resizebytes(x->x_buf, x->x_bufsize, newsize+1);

            for (i = newsize-1; i > x->x_selstart; i--)
                x->x_buf[i] = x->x_buf[i-ch_nbytes];
            x->x_buf[newsize] = 0;
            x->x_bufsize = newsize;
            /*-- moo: assume canvas_key() has encoded keysym as UTF-8 */
            strncpy(x->x_buf+x->x_selstart, keysym->s_name, ch_nbytes);
            x->x_selstart = x->x_selstart + ch_nbytes;
        }
        x->x_selend = x->x_selstart;
        x->x_glist->gl_editor->e_textdirty = 1;
    }
    else if (!strcmp(keysym->s_name, "Home"))
    {
        if (x->x_selend == x->x_selstart)
        {
            x->x_selend = x->x_selstart = 0;
        }
        else
            x->x_selstart = 0;
    }
    else if (!strcmp(keysym->s_name, "End"))
    {
        if (x->x_selend == x->x_selstart)
        {
            x->x_selend = x->x_selstart = x->x_bufsize;
        }
        else
            x->x_selend = x->x_bufsize;
    }
    else if (!strcmp(keysym->s_name, "Right"))
    {
        if (x->x_selend == x->x_selstart && x->x_selstart < x->x_bufsize)
        {
            u8_inc(x->x_buf, &x->x_selstart);
            x->x_selend = x->x_selstart;
        }
        else
            x->x_selstart = x->x_selend;
    }
    else if (!strcmp(keysym->s_name, "Left"))
    {
        if (x->x_selend == x->x_selstart && x->x_selstart > 0)
        {
            u8_dec(x->x_buf, &x->x_selstart);
            x->x_selend = x->x_selstart;
        }
        else
            x->x_selend = x->x_selstart;
    }
        /* this should be improved...  life's too short */
    else if (!strcmp(keysym->s_name, "Up"))
    {
        if (x->x_selstart)
            u8_dec(x->x_buf, &x->x_selstart);
        while (x->x_selstart > 0 && x->x_buf[x->x_selstart] != '\n')
            u8_dec(x->x_buf, &x->x_selstart);
        x->x_selend = x->x_selstart;
    }
    else if (!strcmp(keysym->s_name, "Down"))
    {
        while (x->x_selend < x->x_bufsize &&
            x->x_buf[x->x_selend] != '\n')
            u8_inc(x->x_buf, &x->x_selend);
        if (x->x_selend < x->x_bufsize)
            u8_inc(x->x_buf, &x->x_selend);
        x->x_selstart = x->x_selend;
    }
    rtext_senditup(x, SEND_UPDATE, &w, &h, &indx);
}